

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int doInstall(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  int local_4;
  
  if (in_EDI == 0) {
    fprintf(_stderr,"Error: -install requires further arguments\n");
    local_4 = 3;
  }
  else {
    iVar1 = strcmp(*in_RSI,"qinstall");
    if (iVar1 == 0) {
      local_4 = doQInstall(in_EDI,in_RSI);
    }
    else {
      fprintf(_stderr,"Error: unrecognized -install subcommand \'%s\'\n",*in_RSI);
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static int doInstall(int argc, char **argv)
{
    if (!argc) {
        fprintf(stderr, "Error: -install requires further arguments\n");
        return 3;
    }
#ifdef Q_OS_WIN
    if (!strcmp(argv[0], "sed"))
        return doSed(argc - 1, argv + 1);
    if (!strcmp(argv[0], "ln"))
        return doLink(argc - 1, argv + 1);
#endif
    if (!strcmp(argv[0], "qinstall"))
        return doQInstall(argc - 1, argv + 1);
    fprintf(stderr, "Error: unrecognized -install subcommand '%s'\n", argv[0]);
    return 3;
}